

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_parser.cpp
# Opt level: O2

void PrintUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Usage: square_solver [PARAMETERS] [COEFFICIENTS: a1 b1 c1 ... aN [bN [cN]]]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Solving multiple square equations a*x^2 + b*x + c = 0 with given");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "COEFFICIENTS a b c. Missing trailing coefficients b, c are");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "considered to be 0. Non-numeric data in arguments is filtered out.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-h, --help        print usage");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-s, --silent      don\'t print found solutions")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t-p, --perf        measure request processing time");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t-i, --stdin       interactive mode: get coefficients from stdin");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Examples:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t./square_solver 3 4 5 0 4 -4 11 22 123 45 42 42 67 1001");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t./square_solver 1 -2 -3 0 4 -4 11 22");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t./square_solver 1 2 1 1 4 1 1 -3 2 0 1 -1 0 0 1 0 0 0");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t./square_solver --interactive");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t./square_solver --silent --perf `cat task.txt`")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tcat task.txt | ./square_solver -i");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void PrintUsage() {
    std::cout << "Usage: square_solver [PARAMETERS] [COEFFICIENTS: a1 b1 c1 ... aN [bN [cN]]]" << std::endl;
    std::cout << "Solving multiple square equations a*x^2 + b*x + c = 0 with given" << std::endl;
    std::cout << "COEFFICIENTS a b c. Missing trailing coefficients b, c are" << std::endl;
    std::cout << "considered to be 0. Non-numeric data in arguments is filtered out." << std::endl;
    std::cout << std::endl;
    std::cout << "\t-h, --help        print usage" << std::endl;
    std::cout << "\t-s, --silent      don't print found solutions" << std::endl;
    std::cout << "\t-p, --perf        measure request processing time" << std::endl;
    std::cout << "\t-i, --stdin       interactive mode: get coefficients from stdin" << std::endl;
    std::cout << std::endl;
    std::cout << "Examples:" << std::endl;
    std::cout << "\t./square_solver 3 4 5 0 4 -4 11 22 123 45 42 42 67 1001" << std::endl;
    std::cout << "\t./square_solver 1 -2 -3 0 4 -4 11 22" << std::endl;
    std::cout << "\t./square_solver 1 2 1 1 4 1 1 -3 2 0 1 -1 0 0 1 0 0 0" << std::endl;
    std::cout << "\t./square_solver --interactive" << std::endl;
    std::cout << "\t./square_solver --silent --perf `cat task.txt`" << std::endl;
    std::cout << "\tcat task.txt | ./square_solver -i" << std::endl;
}